

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngstest.c
# Opt level: O1

void gpc_gb16(Pixel *out,Pixel *in,Background *back)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  
  iVar1 = in->a;
  if (iVar1 < 1) {
    uVar2 = back->ig;
  }
  else {
    if (iVar1 < 0xffff) {
      dVar3 = (1.0 - (double)iVar1 / 65535.0) * back->dg +
              (double)in->g * (((double)iVar1 / 65535.0) / 65535.0);
    }
    else {
      dVar3 = (double)in->g / 65535.0;
    }
    if (dVar3 <= 0.0031308) {
      dVar3 = dVar3 * 12.92;
    }
    else {
      dVar3 = pow(dVar3,0.4166666666666667);
      dVar3 = dVar3 * 1.055 + -0.055;
    }
    dVar3 = floor(dVar3 * 255.0 + 0.5);
    uVar2 = (int)dVar3 & 0xff;
  }
  out->b = uVar2;
  out->g = uVar2;
  out->r = uVar2;
  out->a = 0xff;
  return;
}

Assistant:

static void
gpc_gb16(Pixel *out, const Pixel *in, const Background *back)
{
   if (in->a <= 0)
      out->r = out->g = out->b = back->ig;

   else if (in->a >= 65535)
      out->r = out->g = out->b = isRGB(in->g);

   else
   {
      double a = in->a / 65535.;
      double a1 = 1-a;

      a /= 65535;
      out->r = out->g = out->b = sRGB(in->g * a + back->dg * a1);
   }

   out->a = 255;
}